

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
Analyser::getFunctionParameter
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,Analyser *this,string *s)

{
  int iVar1;
  iterator iVar2;
  mapped_type *__x;
  string *this_00;
  allocator<char> local_41;
  string local_40 [32];
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->_functions)._M_t,s);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_functions)._M_t._M_impl.super__Rb_tree_header) {
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::operator[](&this->_functionParameter,s);
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__x);
    return __return_storage_ptr__;
  }
  this_00 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"function is not exist",&local_41);
  iVar1 = this->_currentLine;
  std::__cxx11::string::string(this_00,local_40);
  *(long *)(this_00 + 0x20) = (long)iVar1;
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

std::vector<char> Analyser::getFunctionParameter(const std::string& s)
{
	if (_functions.find(s) != _functions.end()) {
		return _functionParameter[s];
	}
	throw Error("function is not exist", _currentLine);
}